

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_input.cpp
# Opt level: O1

string * Omega_h::remove_trailing_whitespace(string *__return_storage_ptr__,string *in)

{
  char cVar1;
  size_type sVar2;
  
  sVar2 = in->_M_string_length;
  if (sVar2 != 0) {
    do {
      cVar1 = (in->_M_dataplus)._M_p[sVar2 - 1];
      if ((cVar1 != ' ') && (cVar1 != '\t')) break;
      sVar2 = sVar2 - 1;
    } while (sVar2 != 0);
  }
  std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)in);
  return __return_storage_ptr__;
}

Assistant:

static std::string remove_trailing_whitespace(std::string const& in) {
  std::size_t new_end = 0;
  for (std::size_t ri = 0; ri < in.size(); ++ri) {
    std::size_t i = in.size() - 1 - ri;
    if (in[i] != ' ' && in[i] != '\t') {
      new_end = i + 1;
      break;
    }
  }
  return in.substr(0, new_end);
}